

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

uint256 * __thiscall
node::anon_unknown_2::ChainImpl::getBlockHash
          (uint256 *__return_storage_ptr__,ChainImpl *this,int height)

{
  pointer ppCVar1;
  uint256 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar6;
  Chainstate *pCVar7;
  CBlockIndex **ppCVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  CBlockIndex *local_38;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &cs_main.super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  puVar6 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((puVar6->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  if ((height < 0) ||
     (ppCVar1 = (pCVar7->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (int)((ulong)((long)(pCVar7->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3) <= height)) {
    local_38 = (CBlockIndex *)0x0;
  }
  else {
    local_38 = ppCVar1[(uint)height];
  }
  ppCVar8 = inline_assertion_check<true,CBlockIndex*>
                      (&local_38,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x225,"getBlockHash","chainman().ActiveChain()[height]");
  puVar2 = (*ppCVar8)->phashBlock;
  if (puVar2 != (uint256 *)0x0) {
    uVar3 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    uVar4 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    uVar5 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar5;
    *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar3;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar4;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

uint256 getBlockHash(int height) override
    {
        LOCK(::cs_main);
        return Assert(chainman().ActiveChain()[height])->GetBlockHash();
    }